

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI,Index t,Index *oIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  int iVar4;
  const_reference this_00;
  const_reference pvVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstOHIforT,(ulong)agentI);
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (this_00,(ulong)t);
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  uVar10 = ohI - IVar3;
  uVar6 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
  auVar11._8_56_ = extraout_var;
  auVar11._0_8_ = extraout_XMM0_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar11._0_16_,uVar6);
  iVar8 = t - 1;
  for (lVar9 = 0; (ulong)t << 2 != lVar9; lVar9 = lVar9 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar8);
    auVar12._0_8_ = pow(auVar2._0_8_,auVar1._0_8_);
    auVar12._8_56_ = extraout_var_00;
    uVar7 = vcvttsd2usi_avx512f(auVar12._0_16_);
    iVar8 = iVar8 + -1;
    iVar4 = (int)(uVar10 / uVar7);
    *(int *)((long)oIs + lVar9) = iVar4;
    uVar10 = uVar10 - (int)uVar7 * iVar4;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
    (Index agentI, Index ohI, Index t,  Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index ohIwithinThisT = ohI - CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t));
   
    Index remainder = ohIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrO = GetNrObservations(agentI);
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrO, (double)(stage));
        Index oI_t2 = remainder / b;
        oIs[t2] = oI_t2; 
        remainder -= oI_t2 * b;
    }
}